

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  ostream *poVar2;
  allocator local_119;
  string local_118 [32];
  pluralise local_f8;
  allocator local_c9;
  string local_c8 [32];
  pluralise local_a8;
  Colour local_7a;
  allocator local_79;
  string local_78 [6];
  Colour colour_1;
  allocator local_41;
  string local_40 [39];
  Colour local_19;
  Totals *pTStack_18;
  Colour colour;
  Totals *totals_local;
  ConsoleReporter *this_local;
  
  pTStack_18 = totals;
  sVar1 = Counts::total(&totals->assertions);
  if (sVar1 == 0) {
    std::operator<<((this->super_StreamingReporterBase).stream,"No tests ran");
  }
  else if ((pTStack_18->assertions).failed == 0) {
    Colour::Colour(&local_7a,BrightGreen);
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"All tests passed (");
    sVar1 = (pTStack_18->assertions).passed;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"assertion",&local_c9);
    pluralise::pluralise(&local_a8,sVar1,(string *)local_c8);
    poVar2 = Catch::operator<<(poVar2,&local_a8);
    poVar2 = std::operator<<(poVar2," in ");
    sVar1 = (pTStack_18->testCases).passed;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"test case",&local_119);
    pluralise::pluralise(&local_f8,sVar1,(string *)local_118);
    poVar2 = Catch::operator<<(poVar2,&local_f8);
    std::operator<<(poVar2,")");
    pluralise::~pluralise(&local_f8);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    pluralise::~pluralise(&local_a8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    Colour::~Colour(&local_7a);
  }
  else {
    Colour::Colour(&local_19,BrightRed);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"test case",&local_41);
    printCounts(this,(string *)local_40,&pTStack_18->testCases);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if ((pTStack_18->testCases).failed != 0) {
      std::operator<<((this->super_StreamingReporterBase).stream," (");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"assertion",&local_79);
      printCounts(this,(string *)local_78,&pTStack_18->assertions);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      std::operator<<((this->super_StreamingReporterBase).stream,")");
    }
    Colour::~Colour(&local_19);
  }
  return;
}

Assistant:

void printTotals( const Totals& totals ) {
            if( totals.assertions.total() == 0 ) {
                stream << "No tests ran";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                printCounts( "test case", totals.testCases );
                if( totals.testCases.failed > 0 ) {
                    stream << " (";
                    printCounts( "assertion", totals.assertions );
                    stream << ")";
                }
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream << "All tests passed ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")";
            }
        }